

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerSetConcatStrMultiItem(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  RegOpnd *pRVar2;
  bool bVar3;
  uint32 uVar4;
  charcount_t cVar5;
  int32 iVar6;
  Opnd *pOVar7;
  undefined4 *puVar8;
  void *var;
  JITJavascriptString *this_00;
  IndirOpnd *src;
  Instr *pIVar9;
  HelperCallOpnd *newSrc;
  Instr *callInstr;
  Instr *onOverflowInsertBeforeInstr;
  Opnd *srcLength;
  IndirOpnd *dstLength;
  RegOpnd *local_38;
  RegOpnd *srcOpnd;
  RegOpnd *concatStrOpnd;
  IndirOpnd *dstOpnd;
  Func *func;
  Instr *instr_local;
  Lowerer *this_local;
  
  dstOpnd = (IndirOpnd *)this->m_func;
  func = (Func *)instr;
  instr_local = (Instr *)this;
  pOVar7 = IR::Instr::GetDst(instr);
  concatStrOpnd = (RegOpnd *)IR::Opnd::AsIndirOpnd(pOVar7);
  srcOpnd = IR::IndirOpnd::GetBaseOpnd((IndirOpnd *)concatStrOpnd);
  pOVar7 = IR::Instr::UnlinkSrc1((Instr *)func);
  local_38 = IR::Opnd::AsRegOpnd(pOVar7);
  dstLength._6_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&srcOpnd->super_Opnd);
  bVar3 = ValueType::IsString((ValueType *)((long)&dstLength + 6));
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x661c,"(concatStrOpnd->GetValueType().IsString())",
                       "concatStrOpnd->GetValueType().IsString()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  dstLength._4_2_ =
       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
       IR::Opnd::GetValueType(&local_38->super_Opnd);
  bVar3 = ValueType::IsString((ValueType *)((long)&dstLength + 4));
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x661d,"(srcOpnd->GetValueType().IsString())",
                       "srcOpnd->GetValueType().IsString()");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  local_38 = GenerateGetImmutableOrScriptUnreferencedString
                       (this,local_38,(Instr *)func,HelperOp_CompoundStringCloneForConcat,false,true
                       );
  IR::Instr::SetSrc1((Instr *)func,&local_38->super_Opnd);
  pRVar2 = srcOpnd;
  uVar4 = Js::JavascriptString::GetOffsetOfcharLength();
  srcLength = &IR::IndirOpnd::New(pRVar2,uVar4,TyUint32,(Func *)dstOpnd,false)->super_Opnd;
  if ((*(uint *)&local_38->m_sym->field_0x18 >> 10 & 1) == 0) {
    pIVar9 = (Instr *)IR::RegOpnd::New(TyUint32,(Func *)dstOpnd);
    pRVar2 = local_38;
    onOverflowInsertBeforeInstr = pIVar9;
    uVar4 = Js::JavascriptString::GetOffsetOfcharLength();
    src = IR::IndirOpnd::New(pRVar2,uVar4,TyUint32,(Func *)dstOpnd,false);
    InsertMove((Opnd *)pIVar9,&src->super_Opnd,(Instr *)func,true);
  }
  else {
    var = StackSym::GetConstAddress(local_38->m_sym,true);
    this_00 = JITJavascriptString::FromVar(var);
    cVar5 = JITJavascriptString::GetLength(this_00);
    onOverflowInsertBeforeInstr =
         (Instr *)IR::IntConstOpnd::New((ulong)cVar5,TyUint32,(Func *)dstOpnd,false);
  }
  InsertAddWithOverflowCheck
            (false,srcLength,srcLength,(Opnd *)onOverflowInsertBeforeInstr,(Instr *)func,&callInstr)
  ;
  pIVar9 = IR::Instr::New(Call,(Func *)dstOpnd);
  newSrc = IR::HelperCallOpnd::New(HelperOp_OutOfMemoryError,(Func *)dstOpnd);
  IR::Instr::SetSrc1(pIVar9,&newSrc->super_Opnd);
  IR::Instr::InsertBefore((Instr *)func,callInstr);
  IR::Instr::InsertBefore(callInstr,pIVar9);
  LowererMD::LowerCall(&this->m_lowererMD,pIVar9,0);
  pRVar2 = concatStrOpnd;
  iVar6 = IR::IndirOpnd::GetOffset((IndirOpnd *)concatStrOpnd);
  uVar4 = Js::ConcatStringMulti::GetOffsetOfSlots();
  IR::IndirOpnd::SetOffset((IndirOpnd *)pRVar2,iVar6 * 8 + uVar4,false);
  LowererMD::ChangeToWriteBarrierAssign((Instr *)func,(Func *)dstOpnd);
  return;
}

Assistant:

void
Lowerer::LowerSetConcatStrMultiItem(IR::Instr * instr)
{
    Func * func = this->m_func;
    IR::IndirOpnd * dstOpnd = instr->GetDst()->AsIndirOpnd();
    IR::RegOpnd * concatStrOpnd = dstOpnd->GetBaseOpnd();
    IR::RegOpnd * srcOpnd = instr->UnlinkSrc1()->AsRegOpnd();

    Assert(concatStrOpnd->GetValueType().IsString());
    Assert(srcOpnd->GetValueType().IsString());
    srcOpnd = GenerateGetImmutableOrScriptUnreferencedString(srcOpnd, instr, IR::HelperOp_CompoundStringCloneForConcat);
    instr->SetSrc1(srcOpnd);

    IR::IndirOpnd * dstLength = IR::IndirOpnd::New(concatStrOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), TyUint32, func);
    IR::Opnd * srcLength;

    if (srcOpnd->m_sym->m_isStrConst)
    {
        srcLength = IR::IntConstOpnd::New(JITJavascriptString::FromVar(srcOpnd->m_sym->GetConstAddress(true))->GetLength(), TyUint32, func);
    }
    else
    {
        srcLength = IR::RegOpnd::New(TyUint32, func);
        InsertMove(srcLength, IR::IndirOpnd::New(srcOpnd, Js::ConcatStringMulti::GetOffsetOfcharLength(), TyUint32, func), instr);
    }

    IR::Instr *onOverflowInsertBeforeInstr;
    InsertAddWithOverflowCheck(false, dstLength, dstLength, srcLength, instr, &onOverflowInsertBeforeInstr);
    IR::Instr* callInstr = IR::Instr::New(Js::OpCode::Call, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperOp_OutOfMemoryError, func));

    instr->InsertBefore(onOverflowInsertBeforeInstr);
    onOverflowInsertBeforeInstr->InsertBefore(callInstr);
    this->m_lowererMD.LowerCall(callInstr, 0);
    dstOpnd->SetOffset(dstOpnd->GetOffset() * sizeof(Js::JavascriptString *) + Js::ConcatStringMulti::GetOffsetOfSlots());

    LowererMD::ChangeToWriteBarrierAssign(instr, func);
}